

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Ncurses::GetChar
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  int I;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_0_local;
  
  I = wgetch(_stdscr);
  BasicValue::BasicValue(__return_storage_ptr__,I);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::GetChar(std::list<BasicValue> &/*Args*/) {
  return ::wgetch(stdscr);
}